

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QByteArray * qt_convert_to_local_8bit(QByteArray *__return_storage_ptr__,QStringView string)

{
  long in_FS_OFFSET;
  QStringEncoder fromUtf16;
  QStringEncoder local_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (string.m_data == (storage_type_conflict *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    local_58.super_QStringConverter.iface = QStringConverter::encodingInterfaces + 2;
    local_58.super_QStringConverter.state.flags.super_QFlagsStorageHelper<QStringConverter::Flag,_4>
    .super_QFlagsStorage<QStringConverter::Flag>.i =
         (QFlagsStorageHelper<QStringConverter::Flag,_4>)(QFlagsStorage<QStringConverter::Flag>)0x1;
    local_58.super_QStringConverter.state.internalState = 0;
    local_58.super_QStringConverter.state.remainingChars._0_4_ = 0;
    local_58.super_QStringConverter.state.remainingChars._4_4_ = 0;
    local_58.super_QStringConverter.state.invalidChars._0_4_ = 0;
    local_58.super_QStringConverter.state.invalidChars._4_4_ = 0;
    local_58.super_QStringConverter.state.field_4.state_data[0] = 0;
    local_58.super_QStringConverter.state.field_4.state_data[1] = 0;
    local_58.super_QStringConverter.state.field_4.state_data[2] = 0;
    local_58.super_QStringConverter.state.field_4.state_data[3] = 0;
    local_58.super_QStringConverter.state.clearFn = (ClearDataFn)0x0;
    QStringEncoder::encodeAsByteArray(__return_storage_ptr__,&local_58,string);
    QStringConverter::State::clear(&local_58.super_QStringConverter.state);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray qt_convert_to_local_8bit(QStringView string)
{
    if (string.isNull())
        return QByteArray();
    QStringEncoder fromUtf16(QStringEncoder::System, QStringEncoder::Flag::Stateless);
    return fromUtf16(string);
}